

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O2

void __thiscall
helics::UnknownHandleManager::processUnknowns
          (UnknownHandleManager *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
          *cfunc)

{
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  *__range1;
  __node_base *p_Var1;
  
  p_Var1 = &(this->unknown_publications)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
    ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1),PUBLICATION,
                 *(pair<helics::GlobalHandle,_unsigned_short> *)(p_Var1 + 5));
  }
  p_Var1 = &(this->unknown_endpoints)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
    ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1),ENDPOINT,
                 *(pair<helics::GlobalHandle,_unsigned_short> *)(p_Var1 + 5));
  }
  p_Var1 = &(this->unknown_inputs)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
    ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1),INPUT,
                 *(pair<helics::GlobalHandle,_unsigned_short> *)(p_Var1 + 5));
  }
  p_Var1 = &(this->unknown_filters)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
    ::operator()(cfunc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1),FILTER,
                 *(pair<helics::GlobalHandle,_unsigned_short> *)(p_Var1 + 5));
  }
  return;
}

Assistant:

void UnknownHandleManager::processUnknowns(
    const std::function<void(const std::string&, InterfaceType, TargetInfo)>& cfunc) const
{
    for (const auto& upub : unknown_publications) {
        cfunc(upub.first, InterfaceType::PUBLICATION, upub.second);
    }
    for (const auto& uept : unknown_endpoints) {
        cfunc(uept.first, InterfaceType::ENDPOINT, uept.second);
    }
    for (const auto& uinp : unknown_inputs) {
        cfunc(uinp.first, InterfaceType::INPUT, uinp.second);
    }
    for (const auto& ufilt : unknown_filters) {
        cfunc(ufilt.first, InterfaceType::FILTER, ufilt.second);
    }
}